

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacheck.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  FILE *__stream;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  int *piVar8;
  undefined4 uVar9;
  ulong uVar10;
  bool bVar11;
  long lStack_430;
  char filename [1000];
  
  option_verbose = 0;
  option_quick = 0;
  option_require_definition = 0;
  if (argc != 1) {
    pcVar2 = argv[1];
    cVar1 = *pcVar2;
    if ((((cVar1 != '-') || (pcVar2[1] != 'h')) || (pcVar2[2] != '\0')) &&
       (iVar3 = strcmp(pcVar2,"--help"), iVar3 != 0)) {
      if ((((cVar1 == '-') && (pcVar2[1] == 'v')) && (pcVar2[2] == '\0')) ||
         (iVar3 = strcmp(pcVar2,"--version"), iVar3 == 0)) {
        print_version();
        goto LAB_00101639;
      }
      if (((argc < 3 || cVar1 != '-') || (pcVar2[1] != 'D')) || (pcVar2[2] != '\0')) {
        iVar3 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        if (iVar3 == 0) {
          lStack_430 = 1;
          goto LAB_001013b9;
        }
      }
      else {
        coda_set_definition_path(argv[2]);
        lStack_430 = 3;
LAB_001013b9:
        uVar9 = 1;
        for (; bVar11 = true, lStack_430 < argc; lStack_430 = lStack_430 + 1) {
          pcVar2 = argv[lStack_430];
          cVar1 = *pcVar2;
          if (((cVar1 == '-') && (pcVar2[1] == 'V')) &&
             (piVar8 = &option_verbose, pcVar2[2] == '\0')) {
LAB_0010148e:
            *piVar8 = 1;
            uVar6 = uVar9;
          }
          else {
            iVar3 = strcmp(pcVar2,"--verbose");
            piVar8 = &option_verbose;
            if ((iVar3 == 0) ||
               (((cVar1 == '-' && (pcVar2[1] == 'q')) && (piVar8 = &option_quick, pcVar2[2] == '\0')
                ))) goto LAB_0010148e;
            iVar3 = strcmp(pcVar2,"--quick");
            piVar8 = &option_quick;
            if ((iVar3 == 0) ||
               (((cVar1 == '-' && (pcVar2[1] == 'd')) &&
                (piVar8 = &option_require_definition, pcVar2[2] == '\0')))) goto LAB_0010148e;
            iVar3 = strcmp(pcVar2,"--definition");
            piVar8 = &option_require_definition;
            if (iVar3 == 0) goto LAB_0010148e;
            iVar3 = strcmp(pcVar2,"--no-mmap");
            uVar6 = 0;
            if (iVar3 != 0) {
              if (cVar1 == '-') {
                if ((pcVar2[1] != '\0') || (argc + -1 != (int)lStack_430)) {
                  fwrite("ERROR: invalid arguments\n",0x19,1,_stderr);
                  print_help();
                  goto LAB_0010162c;
                }
                bVar11 = false;
              }
              break;
            }
          }
          uVar9 = uVar6;
        }
        iVar3 = coda_init();
        if (iVar3 == 0) {
          coda_set_option_perform_boundary_checks(0);
          coda_set_option_perform_conversions(0);
          coda_set_option_use_mmap(uVar9);
          if (bVar11) {
            for (; lStack_430 < argc; lStack_430 = lStack_430 + 1) {
              check_file(argv[lStack_430]);
              fflush((FILE *)0x0);
            }
          }
          else {
            uVar10 = 0;
LAB_0010151c:
            do {
              iVar3 = getchar();
              iVar7 = iVar3 << 0x18;
              if ((iVar7 == -0x1000000) || (iVar7 == 0xa000000)) {
                bVar11 = iVar7 == -0x1000000;
              }
              else {
                if (iVar7 != 0xd000000) {
                  filename[uVar10] = (char)iVar3;
                  uVar10 = uVar10 + 1;
                  if (uVar10 == 1000) {
                    __assert_fail("k < 1000",
                                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codacheck/codacheck.c"
                                  ,0x139,"int main(int, char **)");
                  }
                  goto LAB_0010151c;
                }
                iVar3 = getchar();
                if (iVar3 << 0x18 != 0xa000000) {
                  ungetc((iVar3 << 0x18) >> 0x18,_stdin);
                }
                bVar11 = false;
              }
              filename[uVar10 & 0xffffffff] = '\0';
              if (uVar10 != 0) {
                check_file(filename);
                fflush((FILE *)0x0);
              }
              uVar10 = 0;
            } while (!bVar11);
          }
          coda_done();
          if (found_errors == 0) {
            return 0;
          }
          goto LAB_0010162c;
        }
      }
      __stream = _stderr;
      puVar4 = (undefined4 *)coda_get_errno();
      uVar5 = coda_errno_to_string(*puVar4);
      fprintf(__stream,"ERROR: %s\n",uVar5);
LAB_0010162c:
      exit(1);
    }
  }
  print_help();
LAB_00101639:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int option_stdin;
    int option_use_mmap;
    int i;

    option_stdin = 0;
    option_verbose = 0;
    option_quick = 0;
    option_use_mmap = 1;
    option_require_definition = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbose") == 0)
        {
            option_verbose = 1;
        }
        else if (strcmp(argv[i], "-q") == 0 || strcmp(argv[i], "--quick") == 0)
        {
            option_quick = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--definition") == 0)
        {
            option_require_definition = 1;
        }
        else if (strcmp(argv[i], "--no-mmap") == 0)
        {
            option_use_mmap = 0;
        }
        else if (strcmp(argv[i], "-") == 0 && i == argc - 1)
        {
            option_stdin = 1;
            break;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    /* The codacheck program should never navigate beyond the array bounds.
     * We therefore disable to boundary check option to increase performance.
     * Mind that this option does not influence the out-of-bounds check that CODA performs to ensure
     * that a read is performed using a byte offset/size that is within the limits of the total file size.
     */
    coda_set_option_perform_boundary_checks(0);

    /* We disable conversions since this speeds up the check of reading all numerical data */
    coda_set_option_perform_conversions(0);

    /* Set mmap based on the chosen option */
    coda_set_option_use_mmap(option_use_mmap);

    if (option_stdin)
    {
        char filename[1000];
        char c;

        do
        {
            int k;

            k = 0;
            for (;;)
            {
                c = getchar();
                if (c == '\r')
                {
                    char c2;

                    c2 = getchar();
                    /* test for '\r\n' combination */
                    if (c2 != '\n')
                    {
                        /* if the second char is not '\n' put it back in the read buffer */
                        ungetc(c2, stdin);
                    }
                }
                if (c == EOF || c == '\n' || c == '\r')
                {
                    filename[k] = '\0';
                    break;
                }
                filename[k] = c;
                k++;
                assert(k < 1000);
            }
            if (k > 0)
            {
                check_file(filename);
                fflush(NULL);
            }
        } while (c != EOF);
    }
    else
    {
        while (i < argc)
        {
            check_file(argv[i]);
            fflush(NULL);
            i++;
        }
    }

    coda_done();

    if (found_errors)
    {
        exit(1);
    }

    return 0;
}